

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ZSTD_CCtx_params params_00;
  ZSTD_parameters ZVar3;
  size_t sVar4;
  long lVar5;
  ZSTD_CCtx_params *pZVar6;
  undefined8 *puVar7;
  ulong pledgedSrcSize_00;
  byte bVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [24];
  undefined1 in_stack_ffffffffffffff44 [100];
  undefined1 auVar16 [24];
  undefined4 local_58;
  uint uStack_54;
  ZSTD_strategy local_3c;
  
  ZVar3 = params;
  bVar8 = 0;
  uVar12 = params.cParams.minMatch;
  uVar10 = params.cParams.hashLog;
  uVar11 = params.cParams.searchLog;
  uVar9 = params.cParams._0_8_;
  uVar13 = params.cParams._20_8_;
  sVar4 = ZSTD_checkCParams(params.cParams);
  if (sVar4 < 0xffffffffffffff89) {
    pledgedSrcSize_00 = -(ulong)(params.fParams.contentSizeFlag == 0) | pledgedSrcSize;
    if (pledgedSrcSize != 0) {
      pledgedSrcSize_00 = pledgedSrcSize;
    }
    uVar1 = (zcs->requestedParams).format;
    local_3c = params.cParams.strategy;
    uStack_54 = params.cParams.windowLog;
    uVar2 = params.fParams._0_8_;
    (zcs->requestedParams).cParams.searchLog = (int)params.cParams._12_8_;
    (zcs->requestedParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (zcs->requestedParams).cParams.targetLength = params.cParams.targetLength;
    (zcs->requestedParams).cParams.strategy = params.cParams.strategy;
    (zcs->requestedParams).format = uVar1;
    (zcs->requestedParams).cParams.windowLog = uStack_54;
    (zcs->requestedParams).cParams.chainLog = (int)ZVar3.cParams._4_8_;
    (zcs->requestedParams).cParams.hashLog = (int)((ulong)ZVar3.cParams._4_8_ >> 0x20);
    (zcs->requestedParams).cParams.strategy = local_3c;
    (zcs->requestedParams).fParams.contentSizeFlag = (int)uVar2;
    (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)uVar2 >> 0x20);
    (zcs->requestedParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (zcs->requestedParams).compressionLevel = 3;
    pZVar6 = &zcs->requestedParams;
    puVar7 = (undefined8 *)&stack0xffffffffffffff28;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)pZVar6;
      pZVar6 = (ZSTD_CCtx_params *)((long)pZVar6 + (ulong)bVar8 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar10;
    params_00.format = (uint)uVar9;
    params_00.cParams.windowLog = SUB84(uVar9,4);
    params_00.cParams.hashLog = uVar11;
    params_00.cParams.searchLog = uVar12;
    params_00.cParams.minMatch = (uint)uVar13;
    params_00.cParams.targetLength = SUB84(uVar13,4);
    auVar14 = in_stack_ffffffffffffff44._4_12_;
    auVar15 = in_stack_ffffffffffffff44._52_24_;
    auVar16 = in_stack_ffffffffffffff44._76_24_;
    params_00.cParams.strategy = in_stack_ffffffffffffff44._0_4_;
    params_00.fParams.contentSizeFlag = auVar14._0_4_;
    params_00.fParams.checksumFlag = auVar14._4_4_;
    params_00.fParams.noDictIDFlag = auVar14._8_4_;
    params_00.compressionLevel = in_stack_ffffffffffffff44._16_4_;
    params_00.forceWindow = in_stack_ffffffffffffff44._20_4_;
    params_00.attachDictPref = in_stack_ffffffffffffff44._24_4_;
    params_00.nbWorkers = in_stack_ffffffffffffff44._28_4_;
    params_00._60_4_ = in_stack_ffffffffffffff44._32_4_;
    params_00.jobSize = in_stack_ffffffffffffff44._36_8_;
    params_00.overlapLog = in_stack_ffffffffffffff44._44_4_;
    params_00.rsyncable = in_stack_ffffffffffffff44._48_4_;
    params_00.ldmParams.enableLdm = auVar15._0_4_;
    params_00.ldmParams.hashLog = auVar15._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar15._8_4_;
    params_00.ldmParams.minMatchLength = auVar15._12_4_;
    params_00.ldmParams.hashRateLog = auVar15._16_4_;
    params_00.ldmParams.windowLog = auVar15._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar16._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar16._8_8_;
    params_00.customMem.opaque = (void *)auVar16._16_8_;
    sVar4 = ZSTD_initCStream_internal
                      (zcs,dict,dictSize,(ZSTD_CDict *)0x0,params_00,pledgedSrcSize_00);
  }
  return sVar4;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_advanced: pledgedSrcSize=%u, flag=%u",
                (unsigned)pledgedSrcSize, params.fParams.contentSizeFlag);
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    if ((pledgedSrcSize==0) && (params.fParams.contentSizeFlag==0)) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* for compatibility with older programs relying on this behavior. Users should now specify ZSTD_CONTENTSIZE_UNKNOWN. This line will be removed in the future. */
    zcs->requestedParams = ZSTD_assignParamsToCCtxParams(zcs->requestedParams, params);
    return ZSTD_initCStream_internal(zcs, dict, dictSize, NULL /*cdict*/, zcs->requestedParams, pledgedSrcSize);
}